

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

void __thiscall
FascodeUtil::msg::print
          (msg *this,MSG_TYPE msgtype,string *appname,string *character,string *label,
          COLOR_TYPE color,int numberspace,string *message)

{
  COLOR_TYPE CVar1;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_78;
  string local_58;
  COLOR_TYPE local_34;
  string *psStack_30;
  COLOR_TYPE color_local;
  string *label_local;
  string *character_local;
  string *appname_local;
  msg *pmStack_10;
  MSG_TYPE msgtype_local;
  msg *this_local;
  
  local_34 = color;
  psStack_30 = label;
  label_local = character;
  character_local = appname;
  appname_local._4_4_ = msgtype;
  pmStack_10 = this;
  if (msgtype == ERR) {
    std::__cxx11::string::string((string *)&local_58,(string *)appname);
    std::__cxx11::string::string((string *)&local_78,(string *)character);
    std::__cxx11::string::string((string *)&local_a8,(string *)label);
    CVar1 = local_34;
    std::__cxx11::string::string((string *)&local_c8,(string *)message);
    _print(this,(ostream *)&std::cerr,&local_58,&local_78,&local_a8,CVar1,numberspace,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    std::__cxx11::string::string((string *)&local_e8,(string *)appname);
    std::__cxx11::string::string((string *)&local_108,(string *)character);
    std::__cxx11::string::string((string *)&local_128,(string *)label);
    CVar1 = local_34;
    std::__cxx11::string::string((string *)&local_148,(string *)message);
    _print(this,(ostream *)&std::cout,&local_e8,&local_108,&local_128,CVar1,numberspace,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  return;
}

Assistant:

void msg::print(MSG_TYPE msgtype,std::string appname,std::string character,std::string label,COLOR_TYPE color,int numberspace,std::string message){
        if(msgtype == ERR){
            _print(std::cerr,appname,character,label,color,numberspace,message);
        }else{
            _print(std::cout,appname,character,label,color,numberspace,message);
        }
    }